

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

Result * __thiscall
Catch::Clara::Detail::ParserBase::validate(Result *__return_storage_ptr__,ParserBase *this)

{
  ParserBase *this_local;
  
  BasicResult<void>::ok();
  return __return_storage_ptr__;
}

Assistant:

virtual auto validate() const -> Result { return Result::ok(); }